

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffer.cpp
# Opt level: O3

void __thiscall
char_buffer_compare_op_Test::~char_buffer_compare_op_Test(char_buffer_compare_op_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(char_buffer, compare_op)
{
    // Same length, chars
    EXPECT_EQ(ST::char_buffer("abc", 3), ST::char_buffer("abc", 3));
    EXPECT_NE(ST::char_buffer("abc", 3), ST::char_buffer("abd", 3));
    EXPECT_NE(ST::char_buffer("abc", 3), ST::char_buffer("abb", 3));
    EXPECT_NE(ST::char_buffer("abC", 3), ST::char_buffer("abc", 3));
    EXPECT_NE(ST::char_buffer("Abc", 3), ST::char_buffer("abc", 3));
    EXPECT_EQ(ST::char_buffer("", 0), ST::char_buffer());

    // Same length, wchars
    EXPECT_EQ(ST::wchar_buffer(L"abc", 3), ST::wchar_buffer(L"abc", 3));
    EXPECT_NE(ST::wchar_buffer(L"abc", 3), ST::wchar_buffer(L"abd", 3));
    EXPECT_NE(ST::wchar_buffer(L"abc", 3), ST::wchar_buffer(L"abb", 3));
    EXPECT_NE(ST::wchar_buffer(L"abC", 3), ST::wchar_buffer(L"abc", 3));
    EXPECT_NE(ST::wchar_buffer(L"Abc", 3), ST::wchar_buffer(L"abc", 3));
    EXPECT_EQ(ST::wchar_buffer(L"", 0), ST::wchar_buffer());

    // Mismatched length, chars
    EXPECT_NE(ST::char_buffer("abc", 3), ST::char_buffer("ab", 2));
    EXPECT_NE(ST::char_buffer("abc", 3), ST::char_buffer("abcd", 4));
    EXPECT_NE(ST::char_buffer("abc", 3), ST::char_buffer("", 0));
    EXPECT_NE(ST::char_buffer(), ST::char_buffer("abc", 3));

    // Mismatched length, wchars
    EXPECT_NE(ST::wchar_buffer(L"abc", 3), ST::wchar_buffer(L"ab", 2));
    EXPECT_NE(ST::wchar_buffer(L"abc", 3), ST::wchar_buffer(L"abcd", 4));
    EXPECT_NE(ST::wchar_buffer(L"abc", 3), ST::wchar_buffer(L"", 0));
    EXPECT_NE(ST::wchar_buffer(), ST::wchar_buffer(L"abc", 3));
}